

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FmaCase::getInputValues(FmaCase *this,int numValues,void **values)

{
  float *pfVar1;
  deUint32 dVar2;
  DataType dataType;
  Precision precision_00;
  int iVar3;
  char *str;
  const_reference pvVar4;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float fVar5;
  float maxValue;
  float *valuePtr;
  int scalarNdx_1;
  int caseNdx_1;
  int inputNdx_2;
  int inputNdx_1;
  int offs;
  int numScalars;
  int scalarNdx;
  int inputNdx;
  int caseNdx;
  int numSpecialCases;
  float specialCases [10] [3];
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  Vec2 ranges [3];
  void **values_local;
  int numValues_local;
  FmaCase *this_local;
  
  ranges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&rnd.m_rnd.z,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(ranges,-127.0,127.0);
  tcu::Vector<float,_2>::Vector(ranges + 1,-1e+07,1e+07);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar2 ^ 0xac23f);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar4->varType);
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  precision_00 = glu::VarType::getPrecision(&pvVar4->varType);
  iVar3 = glu::getDataTypeScalarSize(dataType);
  memcpy(&caseNdx,&DAT_02c0dea0,0x78);
  for (scalarNdx = 0; scalarNdx < 10; scalarNdx = scalarNdx + 1) {
    for (numScalars = 0; numScalars < 3; numScalars = numScalars + 1) {
      for (offs = 0; offs < iVar3; offs = offs + 1) {
        *(int *)(*(long *)((long)ranges[2].m_data + (long)numScalars * 8) +
                (long)(scalarNdx * iVar3 + offs) * 4) =
             (&caseNdx)[(long)scalarNdx * 3 + (long)numScalars];
      }
    }
  }
  for (caseNdx_1 = 0; caseNdx_1 < 3; caseNdx_1 = caseNdx_1 + 1) {
    fVar5 = tcu::Vector<float,_2>::x(ranges + ((ulong)precision_00 - 1));
    maxValue = tcu::Vector<float,_2>::y(ranges + ((ulong)precision_00 - 1));
    fillRandomScalars<float>
              ((Random *)&precision,fVar5,maxValue,
               (void *)(*(long *)((long)ranges[2].m_data + (long)caseNdx_1 * 8) +
                       (long)(iVar3 * 10) * 4),(numValues + -10) * iVar3,0);
  }
  for (scalarNdx_1 = 0; scalarNdx_1 < 3; scalarNdx_1 = scalarNdx_1 + 1) {
    for (valuePtr._4_4_ = 0; valuePtr._4_4_ < numValues; valuePtr._4_4_ = valuePtr._4_4_ + 1) {
      for (valuePtr._0_4_ = 0; (int)valuePtr < iVar3; valuePtr._0_4_ = (int)valuePtr + 1) {
        pfVar1 = (float *)(*(long *)((long)ranges[2].m_data + (long)scalarNdx_1 * 8) +
                          (long)(valuePtr._4_4_ * iVar3 + (int)valuePtr) * 4);
        fVar5 = makeFloatRepresentable(*pfVar1,precision_00);
        *pfVar1 = fVar5;
      }
    }
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-127.f,	127.f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd							(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const float				specialCases[][3]			=
		{
			// a		b		c
			{ 0.0f,		0.0f,	0.0f },
			{ 0.0f,		1.0f,	0.0f },
			{ 0.0f,		0.0f,	-1.0f },
			{ 1.0f,		1.0f,	0.0f },
			{ 1.0f,		1.0f,	1.0f },
			{ -1.0f,	1.0f,	0.0f },
			{ 1.0f,		-1.0f,	0.0f },
			{ -1.0f,	-1.0f,	0.0f },
			{ -0.0f,	1.0f,	0.0f },
			{ 1.0f,		-0.0f,	0.0f }
		};
		const int				numSpecialCases				= DE_LENGTH_OF_ARRAY(specialCases);

		// Special cases
		for (int caseNdx = 0; caseNdx < numSpecialCases; caseNdx++)
		{
			for (int inputNdx = 0; inputNdx < 3; inputNdx++)
			{
				for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
					((float*)values[inputNdx])[caseNdx*scalarSize + scalarNdx] = specialCases[caseNdx][inputNdx];
			}
		}

		// Random cases.
		{
			const int	numScalars	= (numValues-numSpecialCases)*scalarSize;
			const int	offs		= scalarSize*numSpecialCases;

			for (int inputNdx = 0; inputNdx < 3; inputNdx++)
				fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[inputNdx] + offs, numScalars);
		}

		// Make sure the values are representable in the target format
		for (int inputNdx = 0; inputNdx < 3; inputNdx++)
		{
			for (int caseNdx = 0; caseNdx < numValues; ++caseNdx)
			{
				for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
				{
					float* const valuePtr = &((float*)values[inputNdx])[caseNdx * scalarSize + scalarNdx];

					*valuePtr = makeFloatRepresentable(*valuePtr, precision);
				}
			}
		}
	}